

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEnvelope.cpp
# Opt level: O0

void __thiscall dsa::CEnvelope::Reset(CEnvelope *this,UINT32 clock,UINT32 rate)

{
  uint local_1c;
  UINT ch;
  UINT32 rate_local;
  UINT32 clock_local;
  CEnvelope *this_local;
  
  this->m_rate = rate;
  this->m_clock = clock;
  this->m_cnt = 0;
  this->m_inc = (int)(0x10000000 / (ulong)this->m_clock) * this->m_rate;
  for (local_1c = 0; local_1c < this->m_ch; local_1c = local_1c + 1) {
    this->m_ci[local_1c].value = 0;
    this->m_ci[local_1c].speed = 0;
    this->m_ci[local_1c].state = FINISH;
  }
  return;
}

Assistant:

void CEnvelope::Reset(UINT32 clock, UINT32 rate) {
  m_rate = rate;
  m_clock = clock;
  m_cnt = 0;
  m_inc = (MAX_CNT/m_clock) * m_rate;
  for(UINT ch=0; ch<m_ch; ch++) {
    m_ci[ch].value = 0;
    m_ci[ch].speed = 0;
    m_ci[ch].state = FINISH;
  }
}